

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.h
# Opt level: O0

cmCommand * __thiscall cmLoadCommandCommand::Clone(cmLoadCommandCommand *this)

{
  cmCommand *this_00;
  cmLoadCommandCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmLoadCommandCommand((cmLoadCommandCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone() { return new cmLoadCommandCommand; }